

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O2

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verifyAll<std::initializer_list<int>>
               (string *header,initializer_list<int> *list,
               function<void_(int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *converter,
               Options *options)

{
  iterator local_58;
  iterator local_50;
  function<void_(const_int_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)> local_48;
  
  local_50 = list->_M_array;
  local_58 = local_50 + list->_M_len;
  ::std::function<void(int_const&,std::ostream&)>::
  function<std::function<void(int,std::ostream&)>&,void>
            ((function<void(int_const&,std::ostream&)> *)&local_48,converter);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
  verifyAll<const_int_*>(header,&local_50,&local_58,&local_48,options);
  ::std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return;
}

Assistant:

static void verifyAll(
            const std::string& header,
            const Container& list,
            std::function<void(typename Container::value_type, std::ostream&)> converter,
            const Options& options = Options())
        {
            verifyAll<typename Container::const_iterator>(
                header, list.begin(), list.end(), converter, options);
        }